

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O2

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t _elemsize;
  int *piVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 in_EAX;
  int iVar13;
  int iVar14;
  long lVar15;
  undefined1 auVar16 [16];
  Option *in_stack_ffffffffffffff58;
  Mat local_98;
  Option *local_38;
  
  iVar14 = bottom_blob->w;
  iVar1 = bottom_blob->h;
  iVar2 = this->kernel_w;
  iVar3 = this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  iVar4 = this->stride_w;
  iVar5 = this->kernel_h;
  iVar6 = this->dilation_h;
  iVar7 = this->stride_h;
  iVar8 = this->output_pad_right;
  iVar9 = this->output_pad_bottom;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  auVar16._0_4_ = -(uint)(0 < this->pad_left);
  auVar16._4_4_ = -(uint)(0 < this->pad_right);
  auVar16._8_4_ = -(uint)(0 < this->pad_top);
  auVar16._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar13 = movmskps(in_EAX,auVar16);
  lVar15 = 0x10;
  if ((iVar13 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar15 = 8, &local_98 != top_blob)))) {
    piVar10 = top_blob->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    lVar15 = 8;
    local_98.data = top_blob->data;
    local_98.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_98.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_98.elemsize = top_blob->elemsize;
    local_98.elempack = top_blob->elempack;
    local_98.allocator = top_blob->allocator;
    uVar11 = top_blob->dims;
    uVar12 = top_blob->w;
    local_98.h = top_blob->h;
    local_98.d = top_blob->d;
    local_98.c = top_blob->c;
    local_98.cstep = top_blob->cstep;
    local_98.dims = uVar11;
    local_98.w = uVar12;
    local_38 = opt;
  }
  Mat::create(&local_98,iVar8 + (iVar2 + -1) * iVar3 + (iVar14 + -1) * iVar4 + 1,
              iVar9 + 1 + (iVar5 + -1) * iVar6 + (iVar1 + -1) * iVar7,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar15));
  if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) {
    iVar14 = -100;
  }
  else {
    deconvolution(bottom_blob,&local_98,&this->weight_data,&this->bias_data,this->kernel_w,
                  this->kernel_h,this->stride_w,this->stride_h,this->dilation_w,this->dilation_h,
                  this->activation_type,&this->activation_params,in_stack_ffffffffffffff58);
    cut_padding(this,&local_98,top_blob,opt);
    if ((top_blob->data == (void *)0x0) || (iVar14 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
      iVar14 = -100;
    }
  }
  piVar10 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        free(local_98.data);
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolution(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, dilation_w, dilation_h, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}